

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::warn<char[30],std::__cxx11::string>
          (ConsoleLogger *this,char (*args) [30],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  char (*in_RDX) [30];
  ConsoleLogger *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  if (*(int *)((long)&in_RDI[3]._M_string_length + 4) < 3) {
    std::mutex::lock((mutex *)in_RDI);
    if ((in_RDI[3]._M_string_length & 1) != 0) {
      std::operator<<(*(ostream **)in_RDI,(string *)&in_RDI[1]._M_string_length);
    }
    std::operator<<(*(ostream **)in_RDI,"[!] ");
    print<char[30],std::__cxx11::string>(in_RSI,in_RDX,in_RDI);
    if ((in_RDI[3]._M_string_length & 1) != 0) {
      std::operator<<(*(ostream **)in_RDI,"\x1b[0m");
    }
    std::mutex::unlock((mutex *)0x11c59d);
  }
  return;
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}